

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_encoding pugi::impl::anon_unknown_0::guess_buffer_encoding(uint8_t *data,size_t size)

{
  bool bVar1;
  ulong in_RSI;
  uint8_t *in_RDI;
  size_t enc_length;
  uint8_t *enc;
  uint8_t d3;
  uint8_t d2;
  uint8_t d1;
  uint8_t d0;
  size_t local_30;
  byte *local_28;
  uint8_t local_1c;
  uint8_t local_1b;
  uint8_t local_1a;
  uint8_t local_19;
  xml_encoding local_4;
  
  if (in_RSI < 4) {
    local_4 = encoding_utf8;
  }
  else {
    local_19 = *in_RDI;
    local_1a = in_RDI[1];
    local_1b = in_RDI[2];
    local_1c = in_RDI[3];
    if ((((local_19 == '\0') && (local_1a == '\0')) && (local_1b == 0xfe)) && (local_1c == 0xff)) {
      local_4 = encoding_utf32_be;
    }
    else if (((local_19 == 0xff) && (local_1a == 0xfe)) &&
            ((local_1b == '\0' && (local_1c == '\0')))) {
      local_4 = encoding_utf32_le;
    }
    else if ((local_19 == 0xfe) && (local_1a == 0xff)) {
      local_4 = encoding_utf16_be;
    }
    else if ((local_19 == 0xff) && (local_1a == 0xfe)) {
      local_4 = encoding_utf16_le;
    }
    else if (((local_19 == 0xef) && (local_1a == 0xbb)) && (local_1b == 0xbf)) {
      local_4 = encoding_utf8;
    }
    else if (((local_19 == '\0') && (local_1a == '\0')) && ((local_1b == '\0' && (local_1c == '<')))
            ) {
      local_4 = encoding_utf32_be;
    }
    else if ((((local_19 == '<') && (local_1a == '\0')) && (local_1b == '\0')) && (local_1c == '\0')
            ) {
      local_4 = encoding_utf32_le;
    }
    else if ((((local_19 == '\0') && (local_1a == '<')) && (local_1b == '\0')) && (local_1c == '?'))
    {
      local_4 = encoding_utf16_be;
    }
    else if (((local_19 == '<') && (local_1a == '\0')) && ((local_1b == '?' && (local_1c == '\0'))))
    {
      local_4 = encoding_utf16_le;
    }
    else if ((local_19 == '\0') && (local_1a == '<')) {
      local_4 = encoding_utf16_be;
    }
    else if ((local_19 == '<') && (local_1a == '\0')) {
      local_4 = encoding_utf16_le;
    }
    else {
      local_28 = (byte *)0x0;
      local_30 = 0;
      if ((((local_19 == '<') && (local_1a == '?')) && (local_1b == 'x')) &&
         ((local_1c == 'm' &&
          (bVar1 = parse_declaration_encoding(in_RDI,in_RSI,&local_28,&local_30), bVar1)))) {
        if ((((local_30 == 10) && (((*local_28 | 0x20) == 0x69 && ((local_28[1] | 0x20) == 0x73))))
            && ((local_28[2] | 0x20) == 0x6f)) &&
           ((((local_28[3] == 0x2d && (local_28[4] == 0x38)) && (local_28[5] == 0x38)) &&
            (((local_28[6] == 0x35 && (local_28[7] == 0x39)) &&
             ((local_28[8] == 0x2d && (local_28[9] == 0x31)))))))) {
          return encoding_latin1;
        }
        if (((local_30 == 6) && ((*local_28 | 0x20) == 0x6c)) &&
           (((local_28[1] | 0x20) == 0x61 &&
            (((((local_28[2] | 0x20) == 0x74 && ((local_28[3] | 0x20) == 0x69)) &&
              ((local_28[4] | 0x20) == 0x6e)) && (local_28[5] == 0x31)))))) {
          return encoding_latin1;
        }
      }
      local_4 = encoding_utf8;
    }
  }
  return local_4;
}

Assistant:

PUGI__FN xml_encoding guess_buffer_encoding(const uint8_t* data, size_t size)
	{
		// skip encoding autodetection if input buffer is too small
		if (size < 4) return encoding_utf8;

		uint8_t d0 = data[0], d1 = data[1], d2 = data[2], d3 = data[3];

		// look for BOM in first few bytes
		if (d0 == 0 && d1 == 0 && d2 == 0xfe && d3 == 0xff) return encoding_utf32_be;
		if (d0 == 0xff && d1 == 0xfe && d2 == 0 && d3 == 0) return encoding_utf32_le;
		if (d0 == 0xfe && d1 == 0xff) return encoding_utf16_be;
		if (d0 == 0xff && d1 == 0xfe) return encoding_utf16_le;
		if (d0 == 0xef && d1 == 0xbb && d2 == 0xbf) return encoding_utf8;

		// look for <, <? or <?xm in various encodings
		if (d0 == 0 && d1 == 0 && d2 == 0 && d3 == 0x3c) return encoding_utf32_be;
		if (d0 == 0x3c && d1 == 0 && d2 == 0 && d3 == 0) return encoding_utf32_le;
		if (d0 == 0 && d1 == 0x3c && d2 == 0 && d3 == 0x3f) return encoding_utf16_be;
		if (d0 == 0x3c && d1 == 0 && d2 == 0x3f && d3 == 0) return encoding_utf16_le;

		// look for utf16 < followed by node name (this may fail, but is better than utf8 since it's zero terminated so early)
		if (d0 == 0 && d1 == 0x3c) return encoding_utf16_be;
		if (d0 == 0x3c && d1 == 0) return encoding_utf16_le;

		// no known BOM detected; parse declaration
		const uint8_t* enc = 0;
		size_t enc_length = 0;

		if (d0 == 0x3c && d1 == 0x3f && d2 == 0x78 && d3 == 0x6d && parse_declaration_encoding(data, size, enc, enc_length))
		{
			// iso-8859-1 (case-insensitive)
			if (enc_length == 10
				&& (enc[0] | ' ') == 'i' && (enc[1] | ' ') == 's' && (enc[2] | ' ') == 'o'
				&& enc[3] == '-' && enc[4] == '8' && enc[5] == '8' && enc[6] == '5' && enc[7] == '9'
				&& enc[8] == '-' && enc[9] == '1')
				return encoding_latin1;

			// latin1 (case-insensitive)
			if (enc_length == 6
				&& (enc[0] | ' ') == 'l' && (enc[1] | ' ') == 'a' && (enc[2] | ' ') == 't'
				&& (enc[3] | ' ') == 'i' && (enc[4] | ' ') == 'n'
				&& enc[5] == '1')
				return encoding_latin1;
		}

		return encoding_utf8;
	}